

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O3

void __thiscall irr::video::CNullDriver::addHighLevelShaderMaterialFromFiles(CNullDriver *this)

{
  E_VERTEX_SHADER_TYPE in_ECX;
  c8 *in_RDX;
  path *in_RSI;
  path *in_R8;
  c8 *in_R9;
  E_PIXEL_SHADER_TYPE in_stack_00000008;
  path *in_stack_00000010;
  c8 *in_stack_00000018;
  E_GEOMETRY_SHADER_TYPE in_stack_00000020;
  E_PRIMITIVE_TYPE in_stack_00000028;
  E_PRIMITIVE_TYPE in_stack_00000030;
  u32 in_stack_00000038;
  IShaderConstantSetCallBack *in_stack_00000040;
  E_MATERIAL_TYPE in_stack_00000048;
  s32 in_stack_00000050;
  
  addHighLevelShaderMaterialFromFiles
            ((CNullDriver *)&this[-1].field_0x4a0,in_RSI,in_RDX,in_ECX,in_R8,in_R9,in_stack_00000008
             ,in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
             in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048,
             in_stack_00000050);
  return;
}

Assistant:

s32 CNullDriver::addHighLevelShaderMaterialFromFiles(
		const io::path &vertexShaderProgramFileName,
		const c8 *vertexShaderEntryPointName,
		E_VERTEX_SHADER_TYPE vsCompileTarget,
		const io::path &pixelShaderProgramFileName,
		const c8 *pixelShaderEntryPointName,
		E_PIXEL_SHADER_TYPE psCompileTarget,
		const io::path &geometryShaderProgramFileName,
		const c8 *geometryShaderEntryPointName,
		E_GEOMETRY_SHADER_TYPE gsCompileTarget,
		scene::E_PRIMITIVE_TYPE inType, scene::E_PRIMITIVE_TYPE outType,
		u32 verticesOut,
		IShaderConstantSetCallBack *callback,
		E_MATERIAL_TYPE baseMaterial,
		s32 userData)
{
	io::IReadFile *vsfile = 0;
	io::IReadFile *psfile = 0;
	io::IReadFile *gsfile = 0;

	if (vertexShaderProgramFileName.size()) {
		vsfile = FileSystem->createAndOpenFile(vertexShaderProgramFileName);
		if (!vsfile) {
			os::Printer::log("Could not open vertex shader program file",
					vertexShaderProgramFileName, ELL_WARNING);
		}
	}

	if (pixelShaderProgramFileName.size()) {
		psfile = FileSystem->createAndOpenFile(pixelShaderProgramFileName);
		if (!psfile) {
			os::Printer::log("Could not open pixel shader program file",
					pixelShaderProgramFileName, ELL_WARNING);
		}
	}

	if (geometryShaderProgramFileName.size()) {
		gsfile = FileSystem->createAndOpenFile(geometryShaderProgramFileName);
		if (!gsfile) {
			os::Printer::log("Could not open geometry shader program file",
					geometryShaderProgramFileName, ELL_WARNING);
		}
	}

	s32 result = addHighLevelShaderMaterialFromFiles(
			vsfile, vertexShaderEntryPointName, vsCompileTarget,
			psfile, pixelShaderEntryPointName, psCompileTarget,
			gsfile, geometryShaderEntryPointName, gsCompileTarget,
			inType, outType, verticesOut,
			callback, baseMaterial, userData);

	if (psfile)
		psfile->drop();

	if (vsfile)
		vsfile->drop();

	if (gsfile)
		gsfile->drop();

	return result;
}